

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidBranch(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *this;
  FeatureType *pFVar3;
  ArrayFeatureType *this_00;
  ActivationParams *pAVar4;
  NeuralNetworkLayer *pNVar5;
  NeuralNetwork *pNVar6;
  ostream *poVar7;
  undefined1 local_170 [8];
  Result res;
  BranchLayerParams *branch_layer;
  NeuralNetworkLayer *l4;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l2;
  NeuralNetwork nnElse;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnIf;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnIf._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnIf._80_8_,"B");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnIf._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  nnElse._80_8_ = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)nnElse._80_8_);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnElse._80_8_,"if_relu")
  ;
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnElse._80_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnElse._80_8_,"B");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l2);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l2);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"else_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(pNVar6,EXACT_ARRAY_MAPPING);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(pNVar6);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"condition_producing_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"cond");
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(pNVar6);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_branch(pNVar5);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"branch_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"cond");
  pNVar6 = CoreML::Specification::BranchLayerParams::mutable_ifbranch
                     ((BranchLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar6,(NeuralNetwork *)&l1);
  pNVar6 = CoreML::Specification::BranchLayerParams::mutable_elsebranch
                     ((BranchLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar6,(NeuralNetwork *)&l2);
  CoreML::validate<(MLModelType)500>((Result *)local_170,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_170);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x10e6);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  m._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_170);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l2);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testValidBranch() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // "else" net
    Specification::NeuralNetwork nnElse;
    auto *l2 = nnElse.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("else_relu");
    l2->add_input("A");
    l2->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    branch_layer->mutable_elsebranch()->CopyFrom(nnElse);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_GOOD(res);
    return 0;
}